

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

SUNErrCode SUNContext_SetLogger(SUNContext sunctx,SUNLogger logger)

{
  SUNErrCode SVar1;
  SUNLogger *in_RSI;
  long in_RDI;
  SUNContext sunctx_local_scope_;
  SUNErrCode local_4;
  
  if (in_RDI == 0) {
    local_4 = -0x26fa;
  }
  else {
    if ((*(long *)(in_RDI + 0x10) != 0) && (*(int *)(in_RDI + 0x18) != 0)) {
      SVar1 = SUNLogger_Destroy(in_RSI);
      if (SVar1 != 0) {
        return -0x2702;
      }
      *(undefined8 *)(in_RDI + 0x10) = 0;
    }
    *(SUNLogger **)(in_RDI + 0x10) = in_RSI;
    *(undefined4 *)(in_RDI + 0x18) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNContext_SetLogger(SUNContext sunctx, SUNLogger logger)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);

  /* free any existing logger */
  if (sunctx->logger && sunctx->own_logger)
  {
    if (SUNLogger_Destroy(&(sunctx->logger))) { return SUN_ERR_DESTROY_FAIL; }
    sunctx->logger = NULL;
  }

  /* set logger */
  sunctx->logger     = logger;
  sunctx->own_logger = SUNFALSE;

  return SUN_SUCCESS;
}